

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

void rr::resolveMultisampleStencilBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int iVar1;
  ConstPixelBufferAccess *baseAccess;
  int local_c0;
  int local_bc;
  int x;
  int y;
  ConstPixelBufferAccess local_90;
  undefined1 local_68 [8];
  PixelBufferAccess effectiveDst;
  ConstPixelBufferAccess effectiveSrc;
  MultisampleConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  baseAccess = MultisampleConstPixelBufferAccess::raw(src);
  tcu::getEffectiveDepthStencilAccess
            ((ConstPixelBufferAccess *)&effectiveDst.super_ConstPixelBufferAccess.m_data,baseAccess,
             MODE_STENCIL);
  tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)local_68,dst,MODE_STENCIL);
  iVar1 = MultisampleConstPixelBufferAccess::getNumSamples(src);
  if (iVar1 == 1) {
    MultisampleConstPixelBufferAccess::fromMultisampleAccess
              ((MultisampleConstPixelBufferAccess *)&x,
               (ConstPixelBufferAccess *)&effectiveDst.super_ConstPixelBufferAccess.m_data);
    MultisampleConstPixelBufferAccess::toSinglesampleAccess
              (&local_90,(MultisampleConstPixelBufferAccess *)&x);
    tcu::copy((EVP_PKEY_CTX *)local_68,(EVP_PKEY_CTX *)&local_90);
  }
  else {
    for (local_bc = 0;
        iVar1 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess),
        local_bc < iVar1; local_bc = local_bc + 1) {
      for (local_c0 = 0;
          iVar1 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess),
          local_c0 < iVar1; local_c0 = local_c0 + 1) {
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          ((ConstPixelBufferAccess *)
                           &effectiveDst.super_ConstPixelBufferAccess.m_data,0,local_c0,local_bc);
        tcu::PixelBufferAccess::setPixStencil
                  ((PixelBufferAccess *)local_68,iVar1,local_c0,local_bc,0);
      }
    }
  }
  return;
}

Assistant:

void resolveMultisampleStencilBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	const tcu::ConstPixelBufferAccess	effectiveSrc = tcu::getEffectiveDepthStencilAccess(src.raw(), tcu::Sampler::MODE_STENCIL);
	const tcu::PixelBufferAccess		effectiveDst = tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_STENCIL);

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(effectiveDst, MultisampleConstPixelBufferAccess::fromMultisampleAccess(effectiveSrc).toSinglesampleAccess());
	}
	else
	{
		// Resolve by selecting one
		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
			effectiveDst.setPixStencil(effectiveSrc.getPixStencil(0, x, y), x, y);
	}
}